

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  LodePNGColorType LVar5;
  byte bVar6;
  uchar a_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  LodePNGColorMode *mode;
  LodePNGColorStats *pLVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  uint local_114;
  byte local_10d;
  uchar local_10c;
  byte local_10b;
  byte local_10a;
  byte local_109;
  uint local_108;
  uint local_104;
  LodePNGColorMode *local_100;
  size_t local_f8;
  LodePNGColorStats *local_f0;
  uchar *local_e8;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  size_t local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  ColorTree tree;
  
  local_f8 = (ulong)h * (ulong)w;
  LVar5 = mode_in->colortype;
  local_e8 = in;
  local_114 = lodepng_can_have_alpha(mode_in);
  local_114 = local_114 ^ 1;
  local_100 = mode_in;
  local_104 = lodepng_get_bpp(mode_in);
  uVar7 = stats->bits;
  local_d0 = CONCAT71(local_d0._1_7_,local_104 == 1 && uVar7 == 1);
  local_c4 = 0x101;
  if ((local_104 < 9) &&
     (local_c4 = (1 << ((byte)local_104 & 0x1f)) + stats->numcolors, 0x100 < local_c4)) {
    local_c4 = 0x101;
  }
  bVar18 = (LVar5 & ~LCT_GREY_ALPHA) == LCT_GREY;
  stats->numpixels = stats->numpixels + local_f8;
  uVar15 = stats->allow_palette;
  color_tree_init(&tree);
  if (stats->alpha != 0) {
    local_114 = 1;
  }
  uVar13 = stats->colored;
  local_10d = local_104 <= uVar7;
  local_d8 = (ulong)stats->numcolors;
  bVar19 = (uVar7 == 0x10 || uVar15 == 0) || local_c4 <= stats->numcolors;
  local_f0 = stats;
  if (bVar19) {
LAB_001277bc:
    mode = local_100;
    bVar6 = local_10d;
    uVar7 = (uint)(uVar13 != 0 | bVar18);
    if (local_100->bitdepth == 0x10) {
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      sVar17 = 0;
      do {
        if (local_f8 == sVar17) goto LAB_00127a67;
        getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar17,mode);
        pLVar14 = local_f0;
      } while ((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) &&
              (((b & 0xff) == b >> 8 && (sVar17 = sVar17 + 1, (a & 0xff) == a >> 8))));
      local_f0->bits = 0x10;
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      sVar17 = 0;
      do {
        if (local_f8 == sVar17) break;
        getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar17,mode);
        bVar18 = 1;
        bVar19 = uVar7 == 0;
        uVar7 = 1;
        if (bVar19) {
          if (r == g) {
            bVar18 = 0;
            uVar7 = 0;
            if (r == b) goto LAB_00127901;
          }
          pLVar14->colored = 1;
          bVar18 = 1;
          uVar7 = 1;
        }
LAB_00127901:
        if (local_114 == 0) {
          if ((r == pLVar14->key_r) && (g == pLVar14->key_g)) {
            bVar19 = b == pLVar14->key_b;
          }
          else {
            bVar19 = false;
          }
          if (a == 0xffff) {
            bVar6 = 0;
            local_114 = 0;
            if ((bool)(pLVar14->key != 0 & bVar19)) goto LAB_001279af;
          }
          else {
            if ((a != 0) || (!(bool)(pLVar14->key == 0 | bVar19))) {
LAB_001279af:
              pLVar14->alpha = 1;
              pLVar14->key = 0;
              goto LAB_001279be;
            }
            bVar6 = 0;
            local_114 = 0;
            if (pLVar14->key == 0 && pLVar14->alpha == 0) {
              pLVar14->key = 1;
              pLVar14->key_r = r;
              pLVar14->key_g = g;
              pLVar14->key_b = b;
              bVar6 = 0;
              local_114 = 0;
            }
          }
        }
        else {
LAB_001279be:
          bVar6 = 1;
          local_114 = 1;
        }
        sVar17 = sVar17 + 1;
      } while (!(bool)(bVar18 & bVar6));
      if ((pLVar14->key != 0) && (pLVar14->alpha == 0)) {
        for (sVar17 = 0; local_f8 != sVar17; sVar17 = sVar17 + 1) {
          getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar17,local_100);
          if ((((a != 0) && (r == pLVar14->key_r)) && (g == pLVar14->key_g)) &&
             (b == pLVar14->key_b)) {
            pLVar14->alpha = 1;
            pLVar14->key = 0;
          }
        }
      }
    }
    else {
LAB_00127a67:
      sVar17 = 0;
      r = r & 0xff00;
      g = g & 0xff00;
      b = b & 0xff00;
      a = a & 0xff00;
      pLVar14 = local_f0;
      bVar18 = bVar6 | (byte)local_d0;
      uVar15 = local_104;
      do {
        if (local_f8 == sVar17) break;
        local_d0 = sVar17;
        getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e8,sVar17,mode);
        uVar13 = pLVar14->bits;
        if ((bVar18 & 1) == 0 && uVar13 < 8) {
          uVar8 = 1;
          if ((1 < (byte)((byte)r + 1)) && (uVar8 = 8, (byte)r % 0x11 == 0)) {
            uVar8 = (uint)((byte)r % 0x55 != 0) * 2 + 2;
          }
          if (uVar13 < uVar8) {
            pLVar14->bits = uVar8;
            uVar13 = uVar8;
          }
        }
        local_10d = uVar15 <= uVar13;
        uVar16 = CONCAT71((int7)(sVar17 >> 8),1);
        bVar12 = 1;
        uVar8 = 1;
        bVar6 = (byte)g;
        bVar18 = (byte)b;
        uVar9 = uVar13;
        if (uVar7 == 0) {
          if ((byte)r == (byte)g) {
            bVar12 = 0;
            uVar8 = 0;
            if ((byte)r == (byte)b) goto LAB_00127b8d;
          }
          pLVar14->colored = 1;
          bVar12 = 1;
          uVar8 = 1;
          if (uVar13 < 8) {
            pLVar14->bits = 8;
            uVar9 = 8;
            bVar12 = 1;
          }
        }
LAB_00127b8d:
        a_00 = (uchar)a;
        if (local_114 == 0) {
          if ((pLVar14->key_r == (r & 0xff)) && (pLVar14->key_g == (g & 0xff))) {
            bVar20 = pLVar14->key_b == (b & 0xff);
          }
          else {
            bVar20 = false;
          }
          if ((uchar)a == 0xff) {
            uVar16 = 0;
            local_114 = 0;
            if ((bool)(pLVar14->key != 0 & bVar20)) {
              pLVar14->alpha = 1;
              pLVar14->key = 0;
              if (uVar9 < 8) goto LAB_00127ddd;
              goto LAB_00127b94;
            }
          }
          else {
            if (((uchar)a != '\0') || (!(bool)(pLVar14->key == 0 | bVar20))) {
              pLVar14->alpha = 1;
              pLVar14->key = 0;
              if (uVar9 < 8) {
LAB_00127ddd:
                pLVar14->bits = 8;
                goto LAB_00127b94;
              }
              goto LAB_00127b97;
            }
            uVar16 = 0;
            local_114 = 0;
            if (pLVar14->key == 0 && pLVar14->alpha == 0) {
              pLVar14->key = 1;
              pLVar14->key_r = r & 0xff;
              pLVar14->key_g = g & 0xff;
              pLVar14->key_b = b & 0xff;
              uVar16 = 0;
              local_114 = 0;
            }
          }
        }
        else {
LAB_00127b94:
          uVar16 = CONCAT71((int7)(uVar16 >> 8),1);
LAB_00127b97:
          local_114 = 1;
        }
        if (bVar19) {
          bVar19 = true;
          uVar7 = uVar8;
        }
        else {
          local_e0 = (uint)uVar16;
          local_109 = (byte)r;
          local_c0 = (uint)(byte)g;
          local_bc = (uint)(byte)r;
          local_108 = uVar8;
          local_dc = uVar13;
          iVar10 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(uchar)a);
          if (iVar10 < 0) {
            local_10c = a_00;
            local_10b = bVar18;
            local_10a = bVar6;
            uVar7 = color_tree_add(&tree,(uchar)local_bc,(uchar)local_c0,bVar18,a_00,(uint)local_d8)
            ;
            if (uVar7 != 0) goto LAB_00127e24;
            uVar7 = local_f0->numcolors;
            uVar16 = (ulong)local_e0;
            if ((ulong)uVar7 < 0x100) {
              uVar11 = (ulong)(uVar7 * 4);
              local_f0->palette[(ulong)uVar7 * 4] = local_109;
              local_f0->palette[uVar11 + 1] = local_10a;
              local_f0->palette[uVar11 + 2] = local_10b;
              local_f0->palette[uVar11 + 3] = local_10c;
            }
            uVar7 = uVar7 + 1;
            local_d8 = (ulong)uVar7;
            local_f0->numcolors = uVar7;
            bVar19 = local_c4 <= uVar7;
            mode = local_100;
            pLVar14 = local_f0;
            uVar15 = local_104;
            uVar13 = local_dc;
            uVar7 = local_108;
          }
          else {
            bVar19 = false;
            uVar16 = (ulong)local_e0;
            mode = local_100;
            pLVar14 = local_f0;
            uVar15 = local_104;
            uVar13 = local_dc;
            uVar7 = local_108;
          }
        }
        sVar17 = local_d0 + 1;
        bVar18 = local_10d;
      } while (((bVar12 & (byte)uVar16 & bVar19) != 1) || (uVar13 < uVar15));
      if ((pLVar14->key != 0) && (pLVar14->alpha == 0)) {
        for (sVar17 = 0; local_f8 != sVar17; sVar17 = sVar17 + 1) {
          getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e8,sVar17,
                             local_100);
          if (((((uchar)a != '\0') && (pLVar14->key_r == (r & 0xff))) &&
              (pLVar14->key_g == (g & 0xff))) && (pLVar14->key_b == (b & 0xff))) {
            pLVar14->alpha = 1;
            pLVar14->key = 0;
            if (pLVar14->bits < 8) {
              pLVar14->bits = 8;
            }
          }
        }
      }
      uVar1 = pLVar14->key_r;
      uVar2 = pLVar14->key_g;
      uVar3 = pLVar14->key_b;
      uVar4 = *(undefined2 *)&pLVar14->field_0xe;
      auVar21._6_2_ = uVar4;
      auVar21._4_2_ = uVar3;
      auVar21._2_2_ = uVar2;
      auVar21._0_2_ = uVar1;
      auVar22._8_2_ = 0x101;
      auVar22._0_8_ = 0x101010101010101;
      auVar22._10_2_ = 0x101;
      auVar22._12_2_ = 0x101;
      auVar22._14_2_ = 0x101;
      auVar21._8_8_ = 0;
      auVar21 = vpmullw_avx(auVar21,auVar22);
      pLVar14->key_r = (short)auVar21._0_4_;
      pLVar14->key_g = (short)((uint)auVar21._0_4_ >> 0x10);
      pLVar14->key_b = (short)*(undefined4 *)&pLVar14->key_b * 0x101;
    }
    uVar7 = 0;
  }
  else {
    local_108 = CONCAT31(local_108._1_3_,bVar18);
    uVar16 = 0;
    do {
      if (stats->numcolors <= uVar16) {
        bVar18 = (byte)local_108;
        local_d8 = (ulong)stats->numcolors;
        goto LAB_001277bc;
      }
      uVar7 = color_tree_add(&tree,stats->palette[uVar16 * 4],stats->palette[uVar16 * 4 + 1],
                             stats->palette[uVar16 * 4 + 2],stats->palette[uVar16 * 4 + 3],
                             (uint)uVar16);
      uVar16 = uVar16 + 1;
    } while (uVar7 == 0);
  }
LAB_00127e24:
  color_tree_cleanup(&tree);
  return uVar7;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
  const unsigned char* in, unsigned w, unsigned h,
  const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if (bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if (!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if (stats->alpha) alpha_done = 1;
  if (stats->colored) colored_done = 1;
  if (stats->bits == 16) numcolors_done = 1;
  if (stats->bits >= bpp) bits_done = 1;
  if (stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if (!numcolors_done) {
    for (i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
      if (error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if (mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if ((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
        (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if (sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if (!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if (!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if (a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
        else if (a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        }
        else if (a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if (alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if (stats->key && !stats->alpha) {
      for (i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if (a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if (!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if (bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if (!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if (stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if (!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if (a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if (a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        }
        else if (a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if (!numcolors_done) {
        if (!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if (error) goto cleanup;
          if (stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if (alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if (stats->key && !stats->alpha) {
      for (i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if (a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}